

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void fiber_switch(Fiber *from,Fiber *to)

{
  _Bool _Var1;
  Fiber *to_local;
  Fiber *from_local;
  
  if (from != to) {
    _Var1 = fiber_is_executing(from);
    if (!_Var1) {
      __assert_fail("fiber_is_executing(from)",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c"
                    ,0x115,"void fiber_switch(Fiber *, Fiber *)");
    }
    _Var1 = fiber_is_executing(to);
    if (_Var1) {
      __assert_fail("!fiber_is_executing(to)",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c"
                    ,0x116,"void fiber_switch(Fiber *, Fiber *)");
    }
    _Var1 = fiber_is_alive(to);
    if (!_Var1) {
      __assert_fail("fiber_is_alive(to)",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c"
                    ,0x117,"void fiber_switch(Fiber *, Fiber *)");
    }
    from->state = from->state & 0xfffe;
    to->state = to->state | 1;
    fiber_asm_switch(from,to);
  }
  return;
}

Assistant:

void
fiber_switch(Fiber *from, Fiber *to)
{
    NULL_CHECK(from, "Fiber cannot be NULL");
    NULL_CHECK(to, "Fiber cannot be NULL");

    if (from == to)
        return;

    assert(fiber_is_executing(from));
    assert(!fiber_is_executing(to));
    assert(fiber_is_alive(to));
    from->state &= ~FIBER_FS_EXECUTING;
    to->state |= FIBER_FS_EXECUTING;
    fiber_asm_switch(&from->regs, &to->regs);
}